

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O3

void gnilk::Logger::EnableLogger(string *name)

{
  LogManager *name_00;
  Ref log;
  undefined1 local_20 [16];
  
  name_00 = LogManager::Instance();
  LogManager::GetExistingLog((LogManager *)local_20,(string *)name_00);
  if ((_func_int **)local_20._0_8_ != (_func_int **)0x0) {
    *(undefined1 *)(local_20._0_8_ + 0x2c) = 0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_);
  }
  return;
}

Assistant:

void Logger::EnableLogger(const std::string &name) {
    auto log = LogManager::Instance().GetExistingLog(name);
    if (log == nullptr) {
        return;
    }

    log->SetEnabled(false);
}